

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3WalkSelect(Walker *pWalker,Select *p)

{
  Select *pSVar1;
  _func_void_Walker_ptr_Select_ptr *p_Var2;
  SrcList *pSVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  anon_union_8_3_fafd40d6_for_u1 *paVar7;
  
  if (p != (Select *)0x0) {
    pSVar1 = (Select *)pWalker->xSelectCallback;
    while (pSVar1 != (Select *)0x0) {
      uVar4 = (*pWalker->xSelectCallback)(pWalker,p);
      if (uVar4 != 0) {
        return uVar4 & 2;
      }
      iVar5 = sqlite3WalkExprList(pWalker,p->pEList);
      if (iVar5 != 0) {
        return 2;
      }
      iVar5 = sqlite3WalkExpr(pWalker,p->pWhere);
      if (iVar5 != 0) {
        return 2;
      }
      iVar5 = sqlite3WalkExprList(pWalker,p->pGroupBy);
      if (iVar5 != 0) {
        return 2;
      }
      iVar5 = sqlite3WalkExpr(pWalker,p->pHaving);
      if (iVar5 != 0) {
        return 2;
      }
      iVar5 = sqlite3WalkExprList(pWalker,p->pOrderBy);
      if (iVar5 != 0) {
        return 2;
      }
      iVar5 = sqlite3WalkExpr(pWalker,p->pLimit);
      if (iVar5 != 0) {
        return 2;
      }
      if (p->pWinDefn == (Window *)0x0) goto LAB_00168cfa;
      p_Var2 = pWalker->xSelectCallback2;
      if (p_Var2 == sqlite3WalkWinDefnDummyCallback) {
LAB_00168cec:
        iVar5 = walkWindowList(pWalker,p->pWinDefn,0);
        if (iVar5 != 0) {
          return 2;
        }
      }
      else if (pWalker->pParse == (Parse *)0x0) {
        if (p_Var2 == sqlite3SelectPopWith) goto LAB_00168cec;
      }
      else if ((p_Var2 == sqlite3SelectPopWith) || (1 < pWalker->pParse->eParseMode))
      goto LAB_00168cec;
LAB_00168cfa:
      pSVar3 = p->pSrc;
      if (pSVar3 != (SrcList *)0x0) {
        paVar7 = &pSVar3->a[0].u1;
        for (iVar5 = pSVar3->nSrc; 0 < iVar5; iVar5 = iVar5 + -1) {
          if (((Select *)paVar7[-6].pFuncArg != (Select *)0x0) &&
             (iVar6 = sqlite3WalkSelect(pWalker,(Select *)paVar7[-6].pFuncArg), iVar6 != 0)) {
            return 2;
          }
          if ((((ulong)paVar7->zIndexedBy & 0x40000000000) != 0) &&
             (iVar6 = sqlite3WalkExprList(pWalker,paVar7->pFuncArg), iVar6 != 0)) {
            return 2;
          }
          paVar7 = paVar7 + 0xd;
        }
      }
      if (pWalker->xSelectCallback2 != (_func_void_Walker_ptr_Select_ptr *)0x0) {
        (*pWalker->xSelectCallback2)(pWalker,p);
      }
      p = p->pPrior;
      pSVar1 = p;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalkSelect(Walker *pWalker, Select *p){
  int rc;
  if( p==0 ) return WRC_Continue;
  if( pWalker->xSelectCallback==0 ) return WRC_Continue;
  do{
    rc = pWalker->xSelectCallback(pWalker, p);
    if( rc ) return rc & WRC_Abort;
    if( sqlite3WalkSelectExpr(pWalker, p)
     || sqlite3WalkSelectFrom(pWalker, p)
    ){
      return WRC_Abort;
    }
    if( pWalker->xSelectCallback2 ){
      pWalker->xSelectCallback2(pWalker, p);
    }
    p = p->pPrior;
  }while( p!=0 );
  return WRC_Continue;
}